

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O0

_Bool effect_handler_WEB(effect_handler_context_t_conflict *context)

{
  loc grid1;
  loc_conflict grid_00;
  loc_conflict grid_01;
  loc_conflict grid_02;
  _Bool _Var1;
  wchar_t wVar2;
  monster_conflict *pmVar3;
  wchar_t local_30;
  wchar_t wStack_2c;
  loc_conflict grid;
  monster *mon;
  wchar_t rad;
  effect_handler_context_t_conflict *context_local;
  
  mon._4_4_ = L'\x01';
  if (cave->mon_current < L'\x01') {
    context_local._7_1_ = false;
  }
  else {
    pmVar3 = cave_monster(cave,cave->mon_current);
    context->ident = true;
    if (L'(' < pmVar3->race->spell_power) {
      mon._4_4_ = L'\x02';
    }
    if (L'P' < pmVar3->race->spell_power) {
      mon._4_4_ = mon._4_4_ + L'\x01';
    }
    for (wStack_2c = (pmVar3->grid).y - mon._4_4_; wStack_2c <= (pmVar3->grid).y + mon._4_4_;
        wStack_2c = wStack_2c + L'\x01') {
      for (local_30 = (pmVar3->grid).x - mon._4_4_; local_30 <= (pmVar3->grid).x + mon._4_4_;
          local_30 = local_30 + L'\x01') {
        grid1.y = wStack_2c;
        grid1.x = local_30;
        wVar2 = distance(grid1,pmVar3->grid);
        if (((wVar2 <= mon._4_4_) &&
            (grid_00.y = wStack_2c, grid_00.x = local_30,
            _Var1 = square_in_bounds_fully((chunk *)cave,grid_00), _Var1)) &&
           (grid_01.y = wStack_2c, grid_01.x = local_30,
           _Var1 = square_iswebbable((chunk *)cave,grid_01), _Var1)) {
          grid_02.y = wStack_2c;
          grid_02.x = local_30;
          square_add_web((chunk *)cave,grid_02);
        }
      }
    }
    context_local._7_1_ = true;
  }
  return context_local._7_1_;
}

Assistant:

bool effect_handler_WEB(effect_handler_context_t *context)
{
	int rad = 1;
	struct monster *mon = NULL;
	struct loc grid;

	/* Get the monster creating */
	if (cave->mon_current > 0) {
		mon = cave_monster(cave, cave->mon_current);
	} else {
		/* Player can't currently create webs */
		return false;
	}

	/* Always notice */
	context->ident = true;

	/* Increase the radius for higher spell power */
	if (mon->race->spell_power > 40) rad++;
	if (mon->race->spell_power > 80) rad++;

	/* Check within the radius for clear floor */
	for (grid.y = mon->grid.y - rad; grid.y <= mon->grid.y + rad; grid.y++) {
		for (grid.x = mon->grid.x - rad; grid.x <= mon->grid.x + rad; grid.x++){
			if (distance(grid, mon->grid) > rad ||
				!square_in_bounds_fully(cave, grid)) continue;

			/* Require a floor grid with no existing traps or glyphs */
			if (!square_iswebbable(cave, grid)) continue;

			/* Create a web */
			square_add_web(cave, grid);
		}
	}

	return true;
}